

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturetests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_c382::ktxTexture2_MetadataTest_LibVersionUpdatedCorrectly_Test::TestBody
          (ktxTexture2_MetadataTest_LibVersionUpdatedCorrectly_Test *this)

{
  ktx_uint8_t *pkVar1;
  long lVar2;
  Message *pMVar3;
  AssertionResult *this_00;
  AssertHelper *this_01;
  char *pcVar4;
  char *in_R9;
  bool bVar5;
  AssertHelper local_d8;
  AssertionResult gtest_ar__4;
  ktx_error_code_e result;
  AssertionResult gtest_ar_1;
  AssertHelper local_98;
  ktxTexture2 *texture;
  ktx_size_t newMemFileLen;
  ktx_uint8_t *newWriterVal;
  ktx_uint8_t *newMemFile;
  ktx_uint8_t *curWriterVal;
  string curWriter;
  ktx_uint32_t curWriterLen;
  string writer;
  AssertHelper local_20;
  ktx_uint32_t newWriterLen;
  
  pkVar1 = (this->super_ktxTexture2_MetadataTest).
           super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
           super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.ktxMemFile;
  if (pkVar1 == (ktx_uint8_t *)0x0) {
    return;
  }
  result = ktxTexture2_CreateFromMemory
                     (pkVar1,(this->super_ktxTexture2_MetadataTest).
                             super_ktxTexture2TestBase<unsigned_char,_4U,_32856U>.
                             super_ktxTextureTestBase<unsigned_char,_4U,_32856U>.ktxMemFileLen,1,
                      &texture);
  writer._M_string_length = 0;
  writer._M_dataplus._M_p._0_1_ = result == KTX_SUCCESS;
  if (result != KTX_SUCCESS) {
    testing::Message::Message((Message *)&gtest_ar_1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&curWriter,(internal *)&writer,(AssertionResult *)"result == KTX_SUCCESS","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0xabf,curWriter._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar_1);
    goto LAB_00136ac4;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&writer._M_string_length);
  writer._M_string_length = 0;
  writer._M_dataplus._M_p._0_1_ = texture != (ktxTexture2 *)0x0;
  if (texture == (ktxTexture2 *)0x0) {
    testing::Message::Message((Message *)&gtest_ar_1);
    std::operator<<((ostream *)(CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 0x10),
                    "ktxTexture_CreateFromMemory failed: ");
    gtest_ar__4._0_8_ = ktxErrorString(result);
    pMVar3 = testing::Message::operator<<((Message *)&gtest_ar_1,(char **)&gtest_ar__4);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&curWriter,(internal *)&writer,(AssertionResult *)0x16292e,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&curWriterVal,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0xac0,curWriter._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&curWriterVal,pMVar3);
    this_00 = (AssertionResult *)&curWriterVal;
    goto LAB_00136ac9;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&writer._M_string_length);
  writer._M_string_length = 0;
  bVar5 = texture->pData == (ktx_uint8_t *)0x0;
  writer._M_dataplus._M_p._0_1_ = !bVar5;
  if (bVar5) {
    testing::Message::Message((Message *)&gtest_ar_1);
    std::operator<<((ostream *)(CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 0x10),
                    "Image data not loaded");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&curWriter,(internal *)&writer,(AssertionResult *)"texture->pData != __null","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0xac2,curWriter._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar_1);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&writer._M_string_length);
    result = ktxHashList_FindValue(&texture->kvDataHead,"KTXwriter",&curWriterLen,&curWriterVal);
    writer._M_dataplus._M_p._0_4_ = 0;
    testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
              ((internal *)&curWriter,"result","KTX_SUCCESS",&result,(ktx_error_code_e *)&writer);
    if ((char)curWriter._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&writer);
      if (curWriter._M_string_length == 0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)curWriter._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                 ,0xac9,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&writer);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      if ((long *)CONCAT44(writer._M_dataplus._M_p._4_4_,writer._M_dataplus._M_p._0_4_) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(writer._M_dataplus._M_p._4_4_,writer._M_dataplus._M_p._0_4_)
                    + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&curWriter._M_string_length);
    writer._M_string_length = 0;
    writer._M_dataplus._M_p._0_1_ = curWriterVal[curWriterLen - 1] == '\0';
    if (curWriterVal[curWriterLen - 1] == '\0') {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&writer._M_string_length);
      curWriter._M_dataplus._M_p = (pointer)&curWriter.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&curWriter,curWriterVal,curWriterVal + (curWriterLen - 1));
      std::__cxx11::string::string((string *)&writer,(string *)&curWriter);
      lVar2 = std::__cxx11::string::rfind((char)&writer,0x2f);
      gtest_ar__4.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar__4.success_ = lVar2 != -1;
      if (lVar2 == -1) {
        testing::Message::Message((Message *)&newMemFileLen);
        std::operator<<((ostream *)(newMemFileLen + 0x10),"KTXwriter does not have lib version.");
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_1,(internal *)&gtest_ar__4,
                   (AssertionResult *)"slash_pos != std::string::npos","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&newMemFile,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                   ,0xad3,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&newMemFile,(Message *)&newMemFileLen);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&newMemFile);
        std::__cxx11::string::~string((string *)&gtest_ar_1);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar__4.message_);
        std::__cxx11::string::replace((ulong)&writer,lVar2 + 2,(char *)0xffffffffffffffff);
        result = ktxHashList_AddKVPair
                           (&texture->kvDataHead,"KTXwriter",writer._M_string_length & 0xffffffff,
                            CONCAT44(writer._M_dataplus._M_p._4_4_,writer._M_dataplus._M_p._0_4_));
        gtest_ar__4._0_8_ = gtest_ar__4._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
                  ((internal *)&gtest_ar_1,"result","KTX_SUCCESS",&result,
                   (ktx_error_code_e *)&gtest_ar__4);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__4);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&newMemFileLen,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0xada,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&newMemFileLen,(Message *)&gtest_ar__4);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&newMemFileLen);
          if (gtest_ar__4._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__4._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        result = (*texture->vtbl->WriteToMemory)((ktxTexture *)texture,&newMemFile,&newMemFileLen);
        gtest_ar__4._0_8_ = gtest_ar__4._0_8_ & 0xffffffff00000000;
        testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
                  ((internal *)&gtest_ar_1,"result","KTX_SUCCESS",&result,
                   (ktx_error_code_e *)&gtest_ar__4);
        if (gtest_ar_1.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar__4);
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl ==
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)gtest_ar_1.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&newWriterVal,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0xae2,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&newWriterVal,(Message *)&gtest_ar__4);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&newWriterVal);
          if (gtest_ar__4._0_8_ != 0) {
            (**(code **)(*(long *)gtest_ar__4._0_8_ + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_1.message_);
        if (texture != (ktxTexture2 *)0x0) {
          (*texture->vtbl->Destroy)((ktxTexture *)texture);
        }
        result = ktxTexture2_CreateFromMemory(newMemFile,newMemFileLen,1,&texture);
        gtest_ar__4.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar__4.success_ = result == KTX_SUCCESS;
        if (result == KTX_SUCCESS) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar__4.message_);
          gtest_ar__4.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          gtest_ar__4.success_ = texture != (ktxTexture2 *)0x0;
          if (texture != (ktxTexture2 *)0x0) {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(&gtest_ar__4.message_);
            gtest_ar__4.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl =
                 (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                  )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )0x0;
            bVar5 = texture->pData == (ktx_uint8_t *)0x0;
            gtest_ar__4.success_ = !bVar5;
            if (bVar5) {
              testing::Message::Message((Message *)&local_d8);
              std::operator<<((ostream *)
                              (CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) + 0x10),
                              "Image data not loaded");
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_1,(internal *)&gtest_ar__4,
                         (AssertionResult *)"texture->pData != __null","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                         ,0xaf0,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
              testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
            }
            else {
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar__4.message_);
              result = ktxHashList_FindValue
                                 (&texture->kvDataHead,"KTXwriter",&newWriterLen,&newWriterVal);
              gtest_ar__4._0_8_ = gtest_ar__4._0_8_ & 0xffffffff00000000;
              testing::internal::CmpHelperEQ<ktx_error_code_e,ktx_error_code_e>
                        ((internal *)&gtest_ar_1,"result","KTX_SUCCESS",&result,
                         (ktx_error_code_e *)&gtest_ar__4);
              if (gtest_ar_1.success_ == false) {
                testing::Message::Message((Message *)&gtest_ar__4);
                if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )gtest_ar_1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl ==
                    (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)gtest_ar_1.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_d8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                           ,0xaf5,pcVar4);
                testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_ar__4);
                testing::internal::AssertHelper::~AssertHelper(&local_d8);
                if (gtest_ar__4._0_8_ != 0) {
                  (**(code **)(*(long *)gtest_ar__4._0_8_ + 8))();
                }
              }
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_1.message_);
              gtest_ar__4.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )0x0;
              gtest_ar__4.success_ = newWriterVal[newWriterLen - 1] == '\0';
              if (newWriterVal[newWriterLen - 1] == '\0') {
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar__4.message_);
                gtest_ar__4._0_8_ = gtest_ar__4._0_8_ & 0xffffffff00000000;
                local_d8.data_._0_4_ = std::__cxx11::string::compare((char *)&curWriter);
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&gtest_ar_1,"0","curWriter.compare((char *)newWriterVal)",
                           (int *)&gtest_ar__4,(int *)&local_d8);
                if (gtest_ar_1.success_ == false) {
                  testing::Message::Message((Message *)&gtest_ar__4);
                  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )gtest_ar_1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl ==
                      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = *(char **)gtest_ar_1.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_d8,kNonFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                             ,0xaf9,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_d8,(Message *)&gtest_ar__4);
                  testing::internal::AssertHelper::~AssertHelper(&local_d8);
                  if (gtest_ar__4._0_8_ != 0) {
                    (**(code **)(*(long *)gtest_ar__4._0_8_ + 8))();
                  }
                }
                std::
                unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~unique_ptr(&gtest_ar_1.message_);
                if (texture != (ktxTexture2 *)0x0) {
                  (*texture->vtbl->Destroy)((ktxTexture *)texture);
                }
                free(newMemFile);
                goto LAB_00137138;
              }
              testing::Message::Message((Message *)&local_d8);
              std::operator<<((ostream *)
                              (CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) + 0x10),
                              "KTXwriter not NUL terminated");
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_1,(internal *)&gtest_ar__4,
                         (AssertionResult *)"newWriterVal[newWriterLen-1] == \'\\0\'","false","true"
                         ,in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                         ,0xaf6,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
              testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
            }
            goto LAB_0013710d;
          }
          testing::Message::Message((Message *)&local_d8);
          std::operator<<((ostream *)(CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_) + 0x10),
                          "ktxTexture_CreateFromMemory failed: ");
          local_98.data_ = (AssertHelperData *)ktxErrorString(result);
          pMVar3 = testing::Message::operator<<((Message *)&local_d8,(char **)&local_98);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_1,(internal *)&gtest_ar__4,(AssertionResult *)0x16292e,
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_20,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0xaee,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
          testing::internal::AssertHelper::operator=(&local_20,pMVar3);
          this_01 = &local_20;
        }
        else {
          testing::Message::Message((Message *)&local_d8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_1,(internal *)&gtest_ar__4,
                     (AssertionResult *)"result == KTX_SUCCESS","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_98,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
                     ,0xaed,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
          testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
LAB_0013710d:
          this_01 = &local_98;
        }
        testing::internal::AssertHelper::~AssertHelper(this_01);
        std::__cxx11::string::~string((string *)&gtest_ar_1);
        newMemFileLen = CONCAT44(local_d8.data_._4_4_,local_d8.data_._0_4_);
      }
      if ((long *)newMemFileLen != (long *)0x0) {
        (**(code **)(*(long *)newMemFileLen + 8))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__4.message_);
LAB_00137138:
      std::__cxx11::string::~string((string *)&writer);
      std::__cxx11::string::~string((string *)&curWriter);
      return;
    }
    testing::Message::Message((Message *)&gtest_ar_1);
    std::operator<<((ostream *)(CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 0x10),
                    "KTXwriter not NUL terminated");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&curWriter,(internal *)&writer,
               (AssertionResult *)"curWriterVal[curWriterLen-1] == \'\\0\'","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tests/texturetests/texturetests.cc"
               ,0xacc,curWriter._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4,(Message *)&gtest_ar_1);
  }
LAB_00136ac4:
  this_00 = &gtest_ar__4;
LAB_00136ac9:
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
  std::__cxx11::string::~string((string *)&curWriter);
  if ((long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_) + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&writer._M_string_length);
  return;
}

Assistant:

TEST_F(ktxTexture2_MetadataTest, LibVersionUpdatedCorrectly) {
    ktxTexture2* texture;
    KTX_error_code result;

    if (ktxMemFile != NULL) {
        result = ktxTexture2_CreateFromMemory(ktxMemFile, ktxMemFileLen,
                                              KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                              &texture);
        ASSERT_TRUE(result == KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData != NULL) << "Image data not loaded";

        ktx_uint32_t curWriterLen;
        ktx_uint8_t* curWriterVal;
        result = ktxHashList_FindValue(&texture->kvDataHead,
                                       "KTXwriter",
                                        &curWriterLen, (void**)&curWriterVal);
        EXPECT_EQ(result, KTX_SUCCESS);
        // We want ktxWriteTo* to NUL terminate the value when adding
        // the libktx version.
        ASSERT_TRUE(curWriterVal[curWriterLen-1] == '\0')
                    << "KTXwriter not NUL terminated";
        // The pointer returned by FindValue becomes invalid when the texture
        // is destroyed hence saving to this string. -1 to omit the terminator.
        std::string curWriter((char*)curWriterVal, curWriterLen-1);
        std::string writer(curWriter);
        size_t slash_pos = writer.find_last_of('/');
        ASSERT_TRUE(slash_pos != std::string::npos)
                    << "KTXwriter does not have lib version.";
        writer.replace(slash_pos + 2, std::string::npos, "libktx v3.0.0");
        result = ktxHashList_AddKVPair(&texture->kvDataHead,
                                       "KTXwriter",
                                       (ktx_uint32_t)writer.length(),
                                       writer.c_str());
        EXPECT_EQ(result, KTX_SUCCESS);


        ktx_size_t newMemFileLen;
        ktx_uint8_t* newMemFile;
        result = ktxTexture_WriteToMemory(ktxTexture(texture),
                                          &newMemFile,
                                          &newMemFileLen);
        EXPECT_EQ(result, KTX_SUCCESS);

        if (texture)
            ktxTexture_Destroy(ktxTexture(texture));

        ktx_uint32_t newWriterLen;
        ktx_uint8_t* newWriterVal;
        result = ktxTexture2_CreateFromMemory(newMemFile,
                                              newMemFileLen,
                                              KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                              &texture);
        ASSERT_TRUE(result == KTX_SUCCESS);
        ASSERT_TRUE(texture != NULL) << "ktxTexture_CreateFromMemory failed: "
                                     << ktxErrorString(result);
        ASSERT_TRUE(texture->pData != NULL) << "Image data not loaded";

        result = ktxHashList_FindValue(&texture->kvDataHead,
                                       "KTXwriter",
                                        &newWriterLen, (void**)&newWriterVal);
        EXPECT_EQ(result, KTX_SUCCESS);
        ASSERT_TRUE(newWriterVal[newWriterLen-1] == '\0')
                    << "KTXwriter not NUL terminated";

        EXPECT_EQ(0, curWriter.compare((char *)newWriterVal));

        if (texture)
            ktxTexture_Destroy(ktxTexture(texture));

        if (newMemFile)
            free(newMemFile);
    }
}